

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O2

Tone * Tunings::toneFromString(Tone *__return_storage_ptr__,string *fullLine,int lineno)

{
  long lVar1;
  longlong lVar2;
  long lVar3;
  TuningError *this;
  double dVar4;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  Tone::Tone(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->stringRep);
  __return_storage_ptr__->lineno = lineno;
  std::__cxx11::string::find((char *)fullLine,0x10725d);
  std::__cxx11::string::substr((ulong)&line,(ulong)fullLine);
  lVar1 = std::__cxx11::string::find((char)&line,0x2e);
  if (lVar1 == -1) {
    __return_storage_ptr__->type = kToneRatio;
    lVar1 = std::__cxx11::string::find((char)&line,0x2f);
    if (lVar1 == -1) {
      lVar3 = atoll(line._M_dataplus._M_p);
      __return_storage_ptr__->ratio_n = lVar3;
      __return_storage_ptr__->ratio_d = 1;
      lVar1 = 1;
    }
    else {
      std::__cxx11::string::substr((ulong)&s,(ulong)&line);
      lVar2 = atoll(s._M_dataplus._M_p);
      __return_storage_ptr__->ratio_n = lVar2;
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::substr((ulong)&s,(ulong)&line);
      lVar2 = atoll(s._M_dataplus._M_p);
      __return_storage_ptr__->ratio_d = lVar2;
      std::__cxx11::string::~string((string *)&s);
      lVar1 = __return_storage_ptr__->ratio_d;
      lVar3 = __return_storage_ptr__->ratio_n;
    }
    if ((lVar3 == 0) || (lVar1 == 0)) {
      std::__cxx11::string::string((string *)&s,"Invalid tone in SCL file.",(allocator *)&local_c8);
      if (-1 < lineno) {
        std::__cxx11::to_string(&local_68,lineno);
        std::operator+(&local_88,"Line ",&local_68);
        std::operator+(&local_c8,&local_88,".");
        std::__cxx11::string::append((string *)&s);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_68);
      }
      std::operator+(&local_88," Line is \'",&line);
      std::operator+(&local_c8,&local_88,"\'.");
      std::__cxx11::string::append((string *)&s);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_88);
      this = (TuningError *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_48,(string *)&s);
      TuningError::TuningError(this,&local_48);
      __cxa_throw(this,&TuningError::typeinfo,TuningError::~TuningError);
    }
    dVar4 = log((double)lVar3 / (double)lVar1);
    dVar4 = (dVar4 * 1200.0) / 0.6931471805599453;
  }
  else {
    __return_storage_ptr__->type = kToneCents;
    dVar4 = locale_atof(line._M_dataplus._M_p);
  }
  __return_storage_ptr__->cents = dVar4;
  __return_storage_ptr__->floatValue = dVar4 / 1200.0 + 1.0;
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

inline Tone toneFromString(const std::string &fullLine, int lineno)
{
    Tone t;
    t.stringRep = fullLine;
    t.lineno = lineno;

    // Allow end-of-line comments, e.g. "555/524 ! c# 138.75 Hz"
    std::string line = fullLine.substr(0, fullLine.find("!", 0));

    if (line.find('.') != std::string::npos)
    {
        t.type = Tone::kToneCents;
        t.cents = locale_atof(line.c_str());
    }
    else
    {
        t.type = Tone::kToneRatio;
        auto slashPos = line.find('/');
        if (slashPos == std::string::npos)
        {
            t.ratio_n = atoll(line.c_str());
            t.ratio_d = 1;
        }
        else
        {
            t.ratio_n = atoll(line.substr(0, slashPos).c_str());
            t.ratio_d = atoll(line.substr(slashPos + 1).c_str());
        }

        if (t.ratio_n == 0 || t.ratio_d == 0)
        {
            std::string s = "Invalid tone in SCL file.";
            if (lineno >= 0)
                s += "Line " + std::to_string(lineno) + ".";
            s += " Line is '" + line + "'.";
            throw TuningError(s);
        }
        // 2^(cents/1200) = n/d
        // cents = 1200 * log(n/d) / log(2)

        t.cents = 1200 * log(1.0 * t.ratio_n / t.ratio_d) / log(2.0);
    }
    t.floatValue = t.cents / 1200.0 + 1.0;
    return t;
}